

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedSharedTimedMutexTest_LockToTryLockSharedUntil_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedTimedMutexTest_LockToTryLockSharedUntil_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool *pbVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  StringLike<const_char_*> *regex;
  element_type *peVar6;
  DeathTest *gtest_dt;
  TypeParam mtx;
  element_type *local_118;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_110;
  undefined8 uStack_f8;
  AssertHelper local_e8 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  shared_mutex_base<yamc::rwlock::ReaderPrefer> local_b0;
  
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  pbVar1 = &local_110.impl_.full_match_;
  local_110.impl_.full_match_ = false;
  local_110.impl_._17_7_ = 0;
  uStack_f8 = 0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock(&local_b0);
  }
  if (local_110.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_110.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_e8[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_110,(testing *)local_e8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_c8,(PolymorphicMatcher *)&local_110);
    if (local_110.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_110.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.try_lock_shared_until(std::chrono::system_clock::now())",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x1aa,(DeathTest **)&local_118);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c8);
    peVar6 = local_118;
    if (!bVar3) goto LAB_0019bd20;
    if (local_118 == (element_type *)0x0) goto LAB_0019bd76;
    iVar4 = (**(code **)(local_118->pattern_ + 0x10))(local_118);
    peVar2 = local_118;
    if (iVar4 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_110,6);
      iVar4 = (**(code **)(local_118->pattern_ + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_110,iVar4);
      iVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,(ulong)bVar3);
      if ((char)iVar4 == '\0') {
        (**(code **)(peVar6->pattern_ + 8))(peVar6);
        goto LAB_0019bd20;
      }
    }
    else if (iVar4 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        local_110.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)std::chrono::_V2::system_clock::now();
        yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::
        do_try_lock_sharedwait<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&local_110,"recursive try_lock_shared_until");
      }
      (**(code **)(local_118->pattern_ + 0x28))(local_118,2);
      (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
    }
    pcVar5 = peVar6->pattern_;
  }
  else {
LAB_0019bd20:
    testing::Message::Message((Message *)&local_110);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x1aa,pcVar5);
    testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    if (local_110.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_0019bd76;
    pcVar5 = (local_110.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
    peVar6 = local_110.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (**(code **)(pcVar5 + 8))(peVar6);
LAB_0019bd76:
  local_110.impl_.full_match_ = false;
  local_110.impl_._17_7_ = 0;
  uStack_f8 = 0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock(&local_b0);
  }
  if (local_110.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_110.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&local_b0);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedTimedMutexTest, LockToTryLockSharedUntil) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  EXPECT_CHECK_FAILURE(mtx.try_lock_shared_until(std::chrono::system_clock::now()));
  ASSERT_NO_THROW(mtx.unlock());
}